

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xpath_ceiling(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
                 lyxp_set *set,int options)

{
  longdouble lVar1;
  int iVar2;
  int options_local;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t UNUSED_arg_count_local;
  lyxp_set **args_local;
  
  iVar2 = lyxp_set_cast(*args,LYXP_SET_NUMBER,cur_node,param_4,options);
  if (iVar2 == 0) {
    lVar1 = ((*args)->val).num;
    if (((longdouble)(long)ROUND(lVar1) != lVar1) ||
       (NAN((longdouble)(long)ROUND(lVar1)) || NAN(lVar1))) {
      set_fill_number(set,(longdouble)((long)ROUND(((*args)->val).num) + 1));
    }
    else {
      set_fill_number(set,((*args)->val).num);
    }
    args_local._4_4_ = 0;
  }
  else {
    args_local._4_4_ = -1;
  }
  return args_local._4_4_;
}

Assistant:

static int
xpath_ceiling(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
              struct lyxp_set *set, int options)
{
    if (lyxp_set_cast(args[0], LYXP_SET_NUMBER, cur_node, local_mod, options)) {
        return -1;
    }
    if ((long long)args[0]->val.num != args[0]->val.num) {
        set_fill_number(set, ((long long)args[0]->val.num) + 1);
    } else {
        set_fill_number(set, args[0]->val.num);
    }

    return EXIT_SUCCESS;
}